

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
lightconf::value_type_info<std::vector<int,_std::allocator<int>_>_>::extract_value
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,value *val)

{
  pointer pvVar1;
  iterator __position;
  runtime_error *prVar2;
  pointer pvVar3;
  int local_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (val->type_ != vector_type) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"incompatible type requested","");
    std::runtime_error::runtime_error(prVar2,(string *)local_48);
    *(undefined ***)prVar2 = &PTR__runtime_error_00120d78;
    __cxa_throw(prVar2,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = (val->vector_value_).
           super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = (val->vector_value_).
           super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar1) {
    do {
      if (pvVar3->type_ != number_type) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"incompatible type requested","");
        std::runtime_error::runtime_error(prVar2,(string *)local_48);
        *(undefined ***)prVar2 = &PTR__runtime_error_00120d78;
        __cxa_throw(prVar2,&value_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_4c = (int)pvVar3->number_value_;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,__position,&local_4c);
      }
      else {
        *__position._M_current = local_4c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<U> extract_value(const value& val) {
        std::vector<U> v;
        const value_vector_type& inner_vals = val.get<value_vector_type>();
        for (const auto& u : inner_vals) {
            v.push_back(u.get<U>());
        }
        return v;
    }